

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

TryEmplaceResult * __thiscall
QHash<QLoggingCategory*,QtMsgType>::tryEmplace_impl<QLoggingCategory*const&,QtMsgType&>
          (TryEmplaceResult *__return_storage_ptr__,QHash<QLoggingCategory*,QtMsgType> *this,
          QLoggingCategory **key,QtMsgType *args)

{
  uchar uVar1;
  Span *pSVar2;
  Bucket BVar3;
  Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *pDVar4;
  Node<QLoggingCategory_*,_QtMsgType> *pNVar6;
  ulong uVar7;
  uint uVar9;
  long in_FS_OFFSET;
  Bucket BVar10;
  QHash<QLoggingCategory_*,_QtMsgType> local_40;
  long local_38;
  Span *pSVar5;
  ulong uVar8;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = *(Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> **)this;
  if (pDVar4 == (Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *)0x0) {
    pDVar4 = QHashPrivate::Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_>::detached
                       ((Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *)0x0);
    *(Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> **)this = pDVar4;
  }
  local_40.d = (Data *)0x0;
  uVar7 = ((ulong)*key >> 0x20 ^ (ulong)*key) * -0x2917014799a6026d;
  uVar7 = (uVar7 >> 0x20 ^ uVar7) * -0x2917014799a6026d;
  uVar7 = uVar7 >> 0x20 ^ pDVar4->seed ^ uVar7;
  BVar10 = QHashPrivate::Data<QHashPrivate::Node<QLoggingCategory*,QtMsgType>>::
           findBucketWithHash<QLoggingCategory*>
                     ((Data<QHashPrivate::Node<QLoggingCategory*,QtMsgType>> *)pDVar4,key,uVar7);
  uVar8 = BVar10.index;
  pSVar5 = BVar10.span;
  uVar1 = pSVar5->offsets[uVar8];
  pDVar4 = *(Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> **)this;
  if ((pDVar4 == (Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *)0x0) ||
     (1 < (uint)(pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    QHash<QLoggingCategory_*,_QtMsgType>::operator=
              (&local_40,(QHash<QLoggingCategory_*,_QtMsgType> *)this);
    if (uVar1 == 0xff) {
LAB_0024d73a:
      pDVar4 = *(Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> **)this;
      if (pDVar4->numBuckets >> 1 <= pDVar4->size) {
        pDVar4 = QHashPrivate::Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_>::detached
                           (pDVar4,pDVar4->size + 1);
        *(Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> **)this = pDVar4;
        BVar10 = QHashPrivate::Data<QHashPrivate::Node<QLoggingCategory*,QtMsgType>>::
                 findBucketWithHash<QLoggingCategory*>
                           ((Data<QHashPrivate::Node<QLoggingCategory*,QtMsgType>> *)pDVar4,key,
                            uVar7);
        goto LAB_0024d7b8;
      }
    }
    else {
      pDVar4 = *(Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> **)this;
    }
    pSVar2 = pDVar4->spans;
    pDVar4 = QHashPrivate::Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_>::detached
                       (pDVar4);
    *(Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> **)this = pDVar4;
    uVar9 = (uint)BVar10.index & 0x7f;
    BVar10.index._0_4_ = uVar9;
    BVar10.span = pDVar4->spans +
                  ((((ulong)((long)pSVar5 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar8) >> 7);
    BVar10.index._4_4_ = 0;
    BVar3.index._0_4_ = uVar9;
    BVar3.span = pDVar4->spans +
                 ((((ulong)((long)pSVar5 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar8) >> 7);
    BVar3.index._4_4_ = 0;
    if (uVar1 != 0xff) goto LAB_0024d7df;
  }
  else {
    BVar3 = BVar10;
    if (uVar1 != 0xff) goto LAB_0024d7df;
    if (pDVar4->numBuckets >> 1 <= pDVar4->size) {
      QHash<QLoggingCategory_*,_QtMsgType>::operator=
                (&local_40,(QHash<QLoggingCategory_*,_QtMsgType> *)this);
      goto LAB_0024d73a;
    }
  }
LAB_0024d7b8:
  pNVar6 = QHashPrivate::Span<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_>::insert
                     (BVar10.span,BVar10.index);
  pNVar6->key = *key;
  pNVar6->value = *args;
  pDVar4 = *(Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> **)this;
  pDVar4->size = pDVar4->size + 1;
  BVar3 = BVar10;
LAB_0024d7df:
  pSVar5 = pDVar4->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar4;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar3.span - (long)pSVar5) >> 4) * 0x1c71c71c71c71c80 | BVar3.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<QLoggingCategory_*,_QtMsgType>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }